

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line_ncc_rule.cpp
# Opt level: O2

void line_ncc_rule(int n,double a,double b,double *x,double *w)

{
  ulong uVar1;
  void *pvVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  double *pdVar7;
  double *pdVar8;
  ulong uVar9;
  int iVar10;
  double *pdVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  double dVar15;
  double dVar16;
  
  r8vec_linspace(n,a,b,x);
  lVar14 = (long)n;
  uVar9 = 0xffffffffffffffff;
  if (-1 < n) {
    uVar9 = lVar14 * 8;
  }
  uVar1 = 0;
  if (0 < n) {
    uVar1 = (ulong)(uint)n;
  }
  pvVar2 = operator_new__(uVar9);
  for (uVar9 = 0; uVar9 != uVar1; uVar9 = uVar9 + 1) {
    for (uVar5 = 0; (uint)n != uVar5; uVar5 = uVar5 + 1) {
      *(undefined8 *)((long)pvVar2 + uVar5 * 8) = 0;
    }
    *(undefined8 *)((long)pvVar2 + uVar9 * 8) = 0x3ff0000000000000;
    pdVar11 = x + lVar14 + -2;
    for (uVar5 = 2; pdVar8 = x + -2, pdVar7 = pdVar11, uVar13 = 1, uVar12 = uVar5, iVar10 = n,
        uVar5 != n + 1; uVar5 = uVar5 + 1) {
      for (; (long)uVar12 <= lVar14; uVar12 = uVar12 + 1) {
        lVar6 = (long)(iVar10 + -1);
        *(double *)((long)pvVar2 + lVar6 * 8) =
             (*(double *)((long)pvVar2 + (long)iVar10 * 8 + -0x10) -
             *(double *)((long)pvVar2 + lVar6 * 8)) / (*pdVar7 - x[lVar6]);
        pdVar7 = pdVar7 + -1;
        iVar10 = iVar10 + -1;
      }
      pdVar11 = pdVar11 + -1;
    }
    for (; uVar13 != (uint)n; uVar13 = uVar13 + 1) {
      uVar5 = lVar14 * 8;
      for (uVar12 = 1; (long)uVar12 <= (long)(lVar14 - uVar13); uVar12 = uVar12 + 1) {
        *(double *)((long)pvVar2 + (uVar5 - 0x10)) =
             *(double *)((long)pvVar2 + (uVar5 - 0x10)) -
             *(double *)((long)pdVar8 + uVar5) * *(double *)((long)pvVar2 + (uVar5 - 8));
        uVar5 = uVar5 - 8;
      }
      pdVar8 = pdVar8 + -1;
    }
    dVar15 = *(double *)((long)pvVar2 + lVar14 * 8 + -8) / (double)n;
    dVar16 = dVar15;
    for (uVar3 = n - 2U; uVar4 = n - 2U, -1 < (int)uVar3; uVar3 = uVar3 - 1) {
      dVar16 = dVar16 * a + *(double *)((long)pvVar2 + (ulong)uVar3 * 8) / (double)(int)(uVar3 + 1);
    }
    for (; -1 < (int)uVar4; uVar4 = uVar4 - 1) {
      dVar15 = dVar15 * b + *(double *)((long)pvVar2 + (ulong)uVar4 * 8) / (double)(int)(uVar4 + 1);
    }
    w[uVar9] = dVar15 * b - dVar16 * a;
  }
  operator_delete__(pvVar2);
  return;
}

Assistant:

void line_ncc_rule ( int n, double a, double b, double x[], double w[] )

//****************************************************************************80
//
//  Purpose:
//
//    LINE_NCC_RULE computes a Newton-Cotes Closed (NCC) quadrature rule.
//
//  Discussion:
//
//    The integral:
//
//      Integral ( A <= X <= B ) F(X) dx
//
//    The quadrature rule:
//
//      Sum ( 1 <= I <= N ) W(I) * F ( X(I) ).
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    11 April 2014
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int N, the order.
//
//    Input, double A, B, the endpoints of the interval.
//
//    Input, double X[N], the abscissas.
//
//    Output, double W[N], the weights.
//
{
  double *d;
  int i;
  int j;
  int k;
  double y_a;
  double y_b;
//
//  Define the points X.
//
  r8vec_linspace ( n, a, b, x );

  d = new double[n];

  for ( i = 0; i < n; i++ )
  {
//
//  Compute the Lagrange basis polynomial which is 1 at XTAB(I),
//  and zero at the other nodes.
//
    for ( j = 0; j < n; j++ )
    {
      d[j] = 0.0;
    }
    d[i] = 1.0;

    for ( j = 2; j <= n; j++ )
    {
      for ( k = j; k <= n; k++ )
      {
        d[n+j-k-1] = ( d[n+j-k-2] - d[n+j-k-1] ) / ( x[n-k] - x[n+j-k-1] );
      }
    }
    for ( j = 1; j <= n - 1; j++ )
    {
      for ( k = 1; k <= n - j; k++ )
      {
        d[n-k-1] = d[n-k-1] - x[n-k-j] * d[n-k];
      }
    }
//
//  Evaluate the antiderivative of the polynomial at the endpoints.
//
    y_a = d[n-1] / double( n );
    for ( j = n - 2; 0 <= j; j-- )
    {
      y_a = y_a * a + d[j] / double( j + 1 );
    }
    y_a = y_a * a;

    y_b = d[n-1] / double( n );
    for ( j = n - 2; 0 <= j; j-- )
    {
      y_b = y_b * b + d[j] / double( j + 1 );
    }
    y_b = y_b * b;

    w[i] = y_b - y_a;
  }

  delete [] d;

  return;
}